

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O0

Llb_Man_t * Llb_ManStart(Aig_Man_t *pAigGlo,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  Llb_Man_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  Llb_Mtr_t *pLVar3;
  Llb_Man_t *p;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  Aig_Man_t *pAigGlo_local;
  
  Aig_ManCleanMarkA(pAig);
  p_00 = (Llb_Man_t *)calloc(1,0x88);
  p_00->pAigGlo = pAigGlo;
  p_00->pPars = pPars;
  p_00->pAig = pAig;
  pVVar1 = Llb_ManMarkPivotNodes(p_00->pAig,pPars->fUsePivots);
  p_00->vVar2Obj = pVVar1;
  pVVar1 = Vec_IntInvert(p_00->vVar2Obj,-1);
  p_00->vObj2Var = pVVar1;
  pVVar2 = Vec_PtrAlloc(100);
  p_00->vRings = pVVar2;
  Llb_ManPrepareVarMap(p_00);
  Llb_ManPrepareGroups(p_00);
  Aig_ManCleanMarkA(pAig);
  pLVar3 = Llb_MtrCreate(p_00);
  p_00->pMatrix = pLVar3;
  p_00->pMatrix->pMan = p_00;
  return p_00;
}

Assistant:

Llb_Man_t * Llb_ManStart( Aig_Man_t * pAigGlo, Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Man_t * p;
    Aig_ManCleanMarkA( pAig );
    p = ABC_CALLOC( Llb_Man_t, 1 );
    p->pAigGlo  = pAigGlo;
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->vVar2Obj = Llb_ManMarkPivotNodes( p->pAig, pPars->fUsePivots );
    p->vObj2Var = Vec_IntInvert( p->vVar2Obj, -1 );
    p->vRings   = Vec_PtrAlloc( 100 );
    Llb_ManPrepareVarMap( p );
    Llb_ManPrepareGroups( p );
    Aig_ManCleanMarkA( pAig );
    p->pMatrix = Llb_MtrCreate( p );
    p->pMatrix->pMan = p;
    return p;
}